

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DepthRangeAPI::compareDepthRanges<float>
          (DepthRangeAPI *this,vector<float,_std::allocator<float>_> *left,
          vector<float,_std::allocator<float>_> *right,GLchar *description,bool *out_result)

{
  float fVar1;
  unsigned_long uVar2;
  size_type sVar3;
  reference pvVar4;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  MessageBuilder local_1b8;
  unsigned_long local_38;
  size_t i;
  bool *out_result_local;
  GLchar *description_local;
  vector<float,_std::allocator<float>_> *right_local;
  vector<float,_std::allocator<float>_> *left_local;
  DepthRangeAPI *this_local;
  
  i = (size_t)out_result;
  out_result_local = (bool *)description;
  description_local = (GLchar *)right;
  right_local = left;
  left_local = (vector<float,_std::allocator<float>_> *)this;
  for (local_38 = 0; uVar2 = local_38,
      sVar3 = std::vector<float,_std::allocator<float>_>::size(right_local), uVar2 < sVar3;
      local_38 = local_38 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](right_local,local_38);
    fVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)description_local,local_38);
    if ((fVar1 != *pvVar4) || (NAN(fVar1) || NAN(*pvVar4))) {
      this_00 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [12])0x29b365f);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&out_result_local);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" Invalid values [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a0e7f2);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](right_local,local_38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar4);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c6cdd6);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)description_local,local_38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar4);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      *(undefined1 *)i = 0;
    }
  }
  return;
}

Assistant:

void DepthRangeAPI::compareDepthRanges(std::vector<T>& left, std::vector<T>& right, const GLchar* description,
									   bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;
			out_result = false;
		}
	}
}